

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::BP3Writer::BP3Writer(BP3Writer *this,IO *io,string *name,Mode mode,Comm *comm)

{
  Comm *comm_00;
  int iVar1;
  ScopedTimer __var232;
  ScopedTimer local_60;
  Comm local_58;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"BP3",(allocator *)&local_60);
  helper::Comm::Comm(&local_58,comm);
  Engine::Engine(&this->super_Engine,&local_50,io,name,mode,&local_58);
  helper::Comm::~Comm(&local_58);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__BP3Writer_0081be60;
  comm_00 = &(this->super_Engine).m_Comm;
  adios2::format::BP3Serializer::BP3Serializer(&this->m_BP3Serializer,comm_00);
  transportman::TransportMan::TransportMan(&this->m_FileDataManager,io,comm_00);
  transportman::TransportMan::TransportMan(&this->m_FileMetadataManager,io,comm_00);
  this->m_DidBeginStep = false;
  if (BP3Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)::
      __var32 == '\0') {
    iVar1 = __cxa_guard_acquire(&BP3Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
                                 ::__var32);
    if (iVar1 != 0) {
      BP3Writer::__var32 = (void *)ps_timer_create_("BP3Writer::Open");
      __cxa_guard_release(&BP3Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
                           ::__var32);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&local_60,BP3Writer::__var32);
  ((this->super_Engine).m_IO)->m_ReadStreaming = false;
  Init(this);
  (this->super_Engine).m_IsOpen = true;
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_60);
  return;
}

Assistant:

BP3Writer::BP3Writer(IO &io, const std::string &name, const Mode mode, helper::Comm comm)
: Engine("BP3", io, name, mode, std::move(comm)), m_BP3Serializer(m_Comm),
  m_FileDataManager(io, m_Comm), m_FileMetadataManager(io, m_Comm)
{
    PERFSTUBS_SCOPED_TIMER("BP3Writer::Open");
    m_IO.m_ReadStreaming = false;
    Init();
    m_IsOpen = true;
}